

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

char * duckdb_re2::re2_internal::TerminateNumber
                 (char *buf,size_t nbuf,char *str,size_t *np,bool accept_spaces)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  
  sVar7 = *np;
  pcVar6 = anon_var_dwarf_4ed193b + 9;
  if (sVar7 != 0) {
    cVar5 = *str;
    iVar2 = isspace((int)cVar5);
    if (iVar2 == 0) {
LAB_018257f0:
      uVar3 = (ulong)(cVar5 == '-');
      pcVar4 = str + uVar3;
      uVar8 = sVar7 - uVar3;
      if (((2 < uVar8) && (*pcVar4 == '0')) && (pcVar4[1] == '0')) {
        lVar1 = uVar8 + uVar3;
        do {
          if (pcVar4[2] != '0') goto LAB_01825839;
          uVar8 = uVar8 - 1;
          pcVar4 = pcVar4 + 1;
        } while (2 < uVar8);
        uVar8 = 2;
        pcVar4 = str + lVar1 + -2;
      }
LAB_01825839:
      sVar7 = uVar8 + uVar3;
      if (nbuf - 1 < sVar7) {
        return pcVar6;
      }
      memmove(buf,pcVar4 + -uVar3,sVar7);
      if (cVar5 == '-') {
        *buf = '-';
      }
    }
    else {
      if (!accept_spaces) {
        return pcVar6;
      }
      do {
        cVar5 = *str;
        iVar2 = isspace((int)cVar5);
        if (iVar2 == 0) goto LAB_018257f0;
        str = str + 1;
        sVar7 = sVar7 - 1;
      } while (sVar7 != 0);
      sVar7 = 0;
    }
    buf[sVar7] = '\0';
    *np = sVar7;
    pcVar6 = buf;
  }
  return pcVar6;
}

Assistant:

static const char* TerminateNumber(char* buf, size_t nbuf, const char* str,
                                   size_t* np, bool accept_spaces) {
  size_t n = *np;
  if (n == 0) return "";
  if (n > 0 && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces. We do allow leading spaces for floats.
    if (!accept_spaces) {
      return "";
    }
    while (n > 0 && isspace(*str)) {
      n--;
      str++;
    }
  }

  // Although buf has a fixed maximum size, we can still handle
  // arbitrarily large integers correctly by omitting leading zeros.
  // (Numbers that are still too long will be out of range.)
  // Before deciding whether str is too long,
  // remove leading zeros with s/000+/00/.
  // Leaving the leading two zeros in place means that
  // we don't change 0000x123 (invalid) into 0x123 (valid).
  // Skip over leading - before replacing.
  bool neg = false;
  if (n >= 1 && str[0] == '-') {
    neg = true;
    n--;
    str++;
  }

  if (n >= 3 && str[0] == '0' && str[1] == '0') {
    while (n >= 3 && str[2] == '0') {
      n--;
      str++;
    }
  }

  if (neg) {  // make room in buf for -
    n++;
    str--;
  }

  if (n > nbuf-1) return "";

  memmove(buf, str, n);
  if (neg) {
    buf[0] = '-';
  }
  buf[n] = '\0';
  *np = n;
  return buf;
}